

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IMutableRegistryHub * Catch::getMutableRegistryHub(void)

{
  undefined8 *puVar1;
  
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)operator_new(0xd0);
    *puVar1 = &PTR__RegistryHub_00187e80;
    puVar1[1] = &PTR__RegistryHub_00187ed8;
    TestRegistry::TestRegistry((TestRegistry *)(puVar1 + 2));
    puVar1[0xc] = &PTR__ReporterRegistry_00188200;
    *(undefined4 *)(puVar1 + 0xe) = 0;
    puVar1[0xf] = 0;
    puVar1[0x10] = puVar1 + 0xe;
    puVar1[0x11] = puVar1 + 0xe;
    puVar1[0x12] = 0;
    puVar1[0x13] = 0;
    puVar1[0x14] = 0;
    puVar1[0x15] = 0;
    puVar1[0x16] = &PTR__ExceptionTranslatorRegistry_00188250;
    puVar1[0x17] = 0;
    puVar1[0x18] = 0;
    puVar1[0x19] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = puVar1;
  }
  return (IMutableRegistryHub *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 1);
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = CATCH_NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }